

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBlocker.cc
# Opt level: O2

void __thiscall
SignalBlocker_instantiate_Test::~SignalBlocker_instantiate_Test
          (SignalBlocker_instantiate_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SignalBlocker, instantiate)
{
  using SignalType = sigs::Signal<void()>;
  SignalType s;
  sigs::SignalBlocker sb1(s);
  sigs::SignalBlocker<SignalType> sb2(s);
  sigs::SignalBlocker sb3(&s);
  sigs::SignalBlocker<SignalType> sb4(&s);
}